

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_verify(secp256k1_gej *a)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_01;
  secp256k1_ge *a_02;
  secp256k1_ge *a_03;
  secp256k1_ge *psVar13;
  secp256k1_gej *a_04;
  secp256k1_gej *r;
  secp256k1_gej *a_05;
  secp256k1_fe *a_06;
  secp256k1_ge *psVar14;
  secp256k1_ge *r_00;
  secp256k1_ge *a_07;
  undefined1 *puVar15;
  undefined1 auVar16 [16];
  undefined1 auStack_170 [56];
  uint64_t uStack_138;
  uint64_t uStack_130;
  uint64_t uStack_128;
  uint64_t uStack_120;
  undefined8 uStack_118;
  int iStack_114;
  secp256k1_fe *psStack_110;
  secp256k1_ge *psStack_108;
  code *pcStack_100;
  secp256k1_gej *psStack_f0;
  secp256k1_gej *psStack_e8;
  secp256k1_gej *psStack_e0;
  secp256k1_gej *psStack_d0;
  undefined1 auStack_c0 [56];
  uint64_t uStack_88;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  ulong uStack_68;
  uint64_t uStack_60;
  uint64_t uStack_58;
  uint64_t uStack_50;
  uint64_t uStack_48;
  uint64_t uStack_40;
  int iStack_38;
  int iStack_34;
  secp256k1_gej *psStack_30;
  
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  secp256k1_fe_verify(&a->z);
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(a->x).magnitude,4);
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(a->y).magnitude,4);
  a_04 = (secp256k1_gej *)(ulong)(uint)(a->z).magnitude;
  a_00 = (secp256k1_gej *)0x1;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)a_04,1);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_gej_verify_cold_1();
  a_01 = (secp256k1_gej *)auStack_c0;
  a_05 = (secp256k1_gej *)auStack_c0;
  puVar15 = auStack_c0;
  psStack_30 = a;
  secp256k1_gej_verify(a_00);
  a_04->infinity = a_00->infinity;
  secp256k1_fe_mul(&a_04->z,&a_00->z,&a_00->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_c0,&a_00->y);
  r = (secp256k1_gej *)&stack0xffffffffffffffa0;
  psVar12 = a_00;
  secp256k1_fe_sqr((secp256k1_fe *)r,&a_00->x);
  secp256k1_fe_verify((secp256k1_fe *)r);
  if (iStack_38 < 0xb) {
    iStack_38 = iStack_38 * 3;
    psVar12 = (secp256k1_gej *)&stack0xffffffffffffffa0;
    uStack_60 = uStack_60 * 3;
    uStack_58 = uStack_58 * 3;
    uStack_50 = uStack_50 * 3;
    uStack_48 = uStack_48 * 3;
    uStack_40 = uStack_40 * 3;
    iStack_34 = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    secp256k1_fe_half((secp256k1_fe *)psVar12);
    secp256k1_fe_verify((secp256k1_fe *)auStack_c0);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)auStack_c0._40_4_,1);
    auStack_c0._48_8_ = 0x3ffffbfffff0bc - auStack_c0._0_8_;
    uStack_88 = 0x3ffffffffffffc - auStack_c0._8_8_;
    r = (secp256k1_gej *)(auStack_c0 + 0x30);
    uStack_80 = 0x3ffffffffffffc - auStack_c0._16_8_;
    uStack_78 = 0x3ffffffffffffc - auStack_c0._24_8_;
    uStack_70 = 0x3fffffffffffc - auStack_c0._32_8_;
    uStack_68 = 2;
    secp256k1_fe_verify((secp256k1_fe *)r);
    secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&a_00->x);
    secp256k1_fe_sqr(&a_04->x,(secp256k1_fe *)psVar12);
    secp256k1_fe_verify(&a_04->x);
    secp256k1_fe_verify((secp256k1_fe *)r);
    iVar5 = (int)uStack_68 + (a_04->x).magnitude;
    if (0x20 < iVar5) goto LAB_00116bd6;
    uVar2 = (a_04->x).n[1];
    uVar3 = (a_04->x).n[2];
    uVar4 = (a_04->x).n[3];
    a_00 = (secp256k1_gej *)(auStack_c0 + 0x30);
    (a_04->x).n[0] = (a_04->x).n[0] + auStack_c0._48_8_;
    (a_04->x).n[1] = uVar2 + uStack_88;
    (a_04->x).n[2] = uVar3 + uStack_80;
    (a_04->x).n[3] = uVar4 + uStack_78;
    puVar1 = (a_04->x).n + 4;
    *puVar1 = *puVar1 + uStack_70;
    (a_04->x).magnitude = iVar5;
    (a_04->x).normalized = 0;
    secp256k1_fe_verify(&a_04->x);
    secp256k1_fe_verify(&a_04->x);
    r = a_00;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    iVar5 = (int)uStack_68 + (a_04->x).magnitude;
    if (0x20 < iVar5) goto LAB_00116bdb;
    uVar2 = (a_04->x).n[1];
    uVar3 = (a_04->x).n[2];
    uVar4 = (a_04->x).n[3];
    a_00 = (secp256k1_gej *)(auStack_c0 + 0x30);
    (a_04->x).n[0] = (a_04->x).n[0] + auStack_c0._48_8_;
    (a_04->x).n[1] = uVar2 + uStack_88;
    (a_04->x).n[2] = uVar3 + uStack_80;
    (a_04->x).n[3] = uVar4 + uStack_78;
    puVar1 = (a_04->x).n + 4;
    *puVar1 = *puVar1 + uStack_70;
    (a_04->x).magnitude = iVar5;
    (a_04->x).normalized = 0;
    secp256k1_fe_verify(&a_04->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_c0,(secp256k1_fe *)auStack_c0);
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    r = a_04;
    secp256k1_fe_verify(&a_04->x);
    uVar6 = (a_04->x).magnitude + (int)uStack_68;
    if (0x20 < (int)uVar6) goto LAB_00116be0;
    a_01 = (secp256k1_gej *)(auStack_c0 + 0x30);
    auStack_c0._48_8_ = (a_04->x).n[0] + auStack_c0._48_8_;
    uStack_88 = (a_04->x).n[1] + uStack_88;
    uStack_80 = (a_04->x).n[2] + uStack_80;
    uStack_78 = (a_04->x).n[3] + uStack_78;
    uStack_70 = uStack_70 + (a_04->x).n[4];
    uStack_68 = (ulong)uVar6;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    a_00 = (secp256k1_gej *)&a_04->y;
    secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_01,
                     (secp256k1_fe *)&stack0xffffffffffffffa0);
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    secp256k1_fe_verify((secp256k1_fe *)auStack_c0);
    iVar5 = auStack_c0._40_4_ + (a_04->y).magnitude;
    if (iVar5 < 0x21) {
      uVar2 = (a_04->y).n[1];
      uVar3 = (a_04->y).n[2];
      uVar4 = (a_04->y).n[3];
      (a_04->y).n[0] = (a_04->y).n[0] + auStack_c0._0_8_;
      (a_04->y).n[1] = uVar2 + auStack_c0._8_8_;
      (a_04->y).n[2] = uVar3 + auStack_c0._16_8_;
      (a_04->y).n[3] = uVar4 + auStack_c0._24_8_;
      puVar1 = (a_04->y).n + 4;
      *puVar1 = *puVar1 + auStack_c0._32_8_;
      (a_04->y).magnitude = iVar5;
      (a_04->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(a_04->y).magnitude,2);
      uVar2 = (a_04->y).n[1];
      uVar3 = (a_04->y).n[2];
      uVar4 = (a_04->y).n[3];
      (a_04->y).n[0] = 0x5ffff9ffffe91a - (a_04->y).n[0];
      (a_04->y).n[1] = 0x5ffffffffffffa - uVar2;
      (a_04->y).n[2] = 0x5ffffffffffffa - uVar3;
      (a_04->y).n[3] = 0x5ffffffffffffa - uVar4;
      (a_04->y).n[4] = 0x5fffffffffffa - (a_04->y).n[4];
      (a_04->y).magnitude = 3;
      (a_04->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_gej_verify(a_04);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_00116bd6:
    secp256k1_gej_double_cold_4();
LAB_00116bdb:
    a_01 = psVar12;
    secp256k1_gej_double_cold_3();
LAB_00116be0:
    a_05 = r;
    puVar15 = (undefined1 *)&stack0xffffffffffffffa0;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  psStack_e0 = (secp256k1_gej *)0x116bf7;
  psVar12 = a_05;
  psStack_d0 = a_04;
  secp256k1_fe_verify(&a_05->x);
  iVar5 = (a_05->x).magnitude * (int)a_01;
  if (iVar5 < 0x21) {
    uVar7 = (ulong)a_01 & 0xffffffff;
    (a_05->x).n[0] = (a_05->x).n[0] * uVar7;
    (a_05->x).n[1] = (a_05->x).n[1] * uVar7;
    (a_05->x).n[2] = (a_05->x).n[2] * uVar7;
    (a_05->x).n[3] = (a_05->x).n[3] * uVar7;
    (a_05->x).n[4] = uVar7 * (a_05->x).n[4];
    (a_05->x).magnitude = iVar5;
    (a_05->x).normalized = 0;
    secp256k1_fe_verify(&a_05->x);
    return;
  }
  psStack_e0 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  psStack_e8 = (secp256k1_gej *)0x116c61;
  psStack_e0 = a_05;
  secp256k1_fe_verify(&psVar12->x);
  a_06 = (secp256k1_fe *)(ulong)(uint)(psVar12->x).magnitude;
  psStack_e8 = (secp256k1_gej *)0x116c6e;
  secp256k1_fe_verify_magnitude(a_06,0x1f);
  a_02 = (secp256k1_ge *)(psVar12->x).n[0];
  uVar7 = -(ulong)((uint)a_02 & 1);
  uVar9 = uVar7 >> 0xc;
  uVar11 = (long)(a_02->x).n + (uVar9 & 0xffffefffffc2f);
  if ((uVar11 & 1) == 0) {
    uVar8 = (uVar7 >> 0x10) + (psVar12->x).n[4];
    uVar10 = uVar9 + (psVar12->x).n[3];
    uVar6 = (uint)(uVar7 >> 0x2c);
    auVar16._0_8_ = CONCAT44(uVar6,(int)uVar9);
    auVar16._8_4_ = (int)uVar9;
    auVar16._12_4_ = uVar6;
    uVar7 = auVar16._0_8_ + (psVar12->x).n[1];
    uVar9 = auVar16._8_8_ + (psVar12->x).n[2];
    (psVar12->x).n[0] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar11 >> 1);
    (psVar12->x).n[1] = ((uVar9 & 1) << 0x33) + (uVar7 >> 1);
    (psVar12->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar9 >> 1);
    (psVar12->x).n[3] = ((ulong)((uint)uVar8 & 1) << 0x33) + (uVar10 >> 1);
    (psVar12->x).n[4] = uVar8 >> 1;
    (psVar12->x).magnitude = ((psVar12->x).magnitude >> 1) + 1;
    (psVar12->x).normalized = 0;
    secp256k1_fe_verify(&psVar12->x);
    return;
  }
  psStack_e8 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_half_cold_1();
  pcStack_100 = (code *)0x116d3e;
  a_03 = a_02;
  psStack_f0 = psVar12;
  psStack_e8 = a_00;
  secp256k1_fe_verify(a_06);
  pcStack_100 = (code *)0x116d46;
  psVar14 = a_02;
  secp256k1_fe_verify(&a_02->x);
  iVar5 = (a_02->x).magnitude + a_06->magnitude;
  if (iVar5 < 0x21) {
    a_06->n[0] = a_06->n[0] + (a_02->x).n[0];
    a_06->n[1] = a_06->n[1] + (a_02->x).n[1];
    a_06->n[2] = a_06->n[2] + (a_02->x).n[2];
    a_06->n[3] = a_06->n[3] + (a_02->x).n[3];
    a_06->n[4] = a_06->n[4] + (a_02->x).n[4];
    a_06->magnitude = iVar5;
    a_06->normalized = 0;
    secp256k1_fe_verify(a_06);
    return;
  }
  pcStack_100 = secp256k1_ge_to_storage;
  secp256k1_fe_add_cold_1();
  a_07 = (secp256k1_ge *)auStack_170;
  psVar13 = a_03;
  r_00 = a_03;
  psStack_110 = a_06;
  psStack_108 = a_02;
  pcStack_100 = (code *)puVar15;
  secp256k1_ge_verify(a_03);
  if (a_03->infinity == 0) {
    auStack_170._48_8_ = (a_03->x).n[0];
    uStack_138 = (a_03->x).n[1];
    uStack_130 = (a_03->x).n[2];
    uStack_128 = (a_03->x).n[3];
    uStack_120 = (a_03->x).n[4];
    uStack_118._0_4_ = (a_03->x).magnitude;
    iStack_114 = (a_03->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_170 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_170._0_8_ = (a_03->y).n[0];
    auStack_170._8_8_ = (a_03->y).n[1];
    auStack_170._16_8_ = (a_03->y).n[2];
    auStack_170._24_8_ = (a_03->y).n[3];
    auStack_170._32_8_ = (a_03->y).n[4];
    auStack_170._40_4_ = (a_03->y).magnitude;
    auStack_170._44_4_ = (a_03->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_170);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_114 != 0) {
      (psVar14->x).n[0] = uStack_138 << 0x34 | auStack_170._48_8_;
      (psVar14->x).n[1] = uStack_130 << 0x28 | uStack_138 >> 0xc;
      (psVar14->x).n[2] = uStack_128 << 0x1c | uStack_130 >> 0x18;
      (psVar14->x).n[3] = uStack_120 << 0x10 | uStack_128 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_170);
      if (auStack_170._44_4_ != 0) {
        (psVar14->x).n[4] = auStack_170._8_8_ << 0x34 | auStack_170._0_8_;
        uVar7 = auStack_170._16_8_ << 0x28 | (ulong)auStack_170._8_8_ >> 0xc;
        (psVar14->x).magnitude = (int)uVar7;
        (psVar14->x).normalized = (int)(uVar7 >> 0x20);
        (psVar14->y).n[0] = auStack_170._24_8_ << 0x1c | (ulong)auStack_170._16_8_ >> 0x18;
        (psVar14->y).n[1] = auStack_170._32_8_ << 0x10 | (ulong)auStack_170._24_8_ >> 0x24;
        return;
      }
      goto LAB_00116ee8;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_07 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_00116ee8:
  secp256k1_ge_to_storage_cold_2();
  (a_07->x).n[0] = (psVar13->x).n[0] & 0xfffffffffffff;
  (a_07->x).n[1] = ((psVar13->x).n[1] & 0xffffffffff) << 0xc | (psVar13->x).n[0] >> 0x34;
  (a_07->x).n[2] = ((psVar13->x).n[2] & 0xfffffff) << 0x18 | (psVar13->x).n[1] >> 0x28;
  (a_07->x).n[3] = ((psVar13->x).n[3] & 0xffff) << 0x24 | (psVar13->x).n[2] >> 0x1c;
  (a_07->x).n[4] = (psVar13->x).n[3] >> 0x10;
  (a_07->x).magnitude = 1;
  (a_07->x).normalized = 1;
  secp256k1_fe_verify(&a_07->x);
  (a_07->y).n[0] = (psVar13->x).n[4] & 0xfffffffffffff;
  uVar7._0_4_ = (psVar13->x).magnitude;
  uVar7._4_4_ = (psVar13->x).normalized;
  (a_07->y).n[1] = (uVar7 & 0xffffffffff) << 0xc | (psVar13->x).n[4] >> 0x34;
  uVar9._0_4_ = (psVar13->x).magnitude;
  uVar9._4_4_ = (psVar13->x).normalized;
  (a_07->y).n[2] = ((psVar13->y).n[0] & 0xfffffff) << 0x18 | uVar9 >> 0x28;
  (a_07->y).n[3] = ((psVar13->y).n[1] & 0xffff) << 0x24 | (psVar13->y).n[0] >> 0x1c;
  (a_07->y).n[4] = (psVar13->y).n[1] >> 0x10;
  (a_07->y).magnitude = 1;
  (a_07->y).normalized = 1;
  secp256k1_fe_verify(&a_07->y);
  a_07->infinity = 0;
  secp256k1_ge_verify(a_07);
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}